

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall ON_SubDVertex::MinimumFaceEdgeCount(ON_SubDVertex *this)

{
  ON_SubDFace *pOVar1;
  uint local_2c;
  ON_SubDFace *f;
  unsigned_short vfi;
  unsigned_short min_count;
  ON_SubDVertex *this_local;
  
  f._6_2_ = 0xffff;
  for (f._4_2_ = 0; f._4_2_ < this->m_face_count; f._4_2_ = f._4_2_ + 1) {
    pOVar1 = this->m_faces[f._4_2_];
    if ((pOVar1 != (ON_SubDFace *)0x0) && (pOVar1->m_edge_count < f._6_2_)) {
      f._6_2_ = pOVar1->m_edge_count;
    }
  }
  if (f._6_2_ < 0xffff) {
    local_2c = (uint)f._6_2_;
  }
  else {
    local_2c = 0;
  }
  return local_2c;
}

Assistant:

unsigned int ON_SubDVertex::MinimumFaceEdgeCount() const
{
  unsigned short min_count = 0xFFFFU;
  for (unsigned short vfi = 0; vfi < m_face_count; ++vfi)
  {
    const ON_SubDFace* f = m_faces[vfi];
    if (nullptr != f && f->m_edge_count < min_count)
      min_count = f->m_edge_count;
  }
  return min_count < 0xFFFFU ? min_count : 0;
}